

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O1

void __thiscall
chrono::ChBodyEasyConvexHullAuxRef::SetupBody
          (ChBodyEasyConvexHullAuxRef *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *points,
          double density,bool visualize,bool collide,shared_ptr<chrono::ChMaterialSurface> *material
          )

{
  double *pdVar1;
  ChTriangleMeshConnected *pCVar2;
  element_type *peVar3;
  pointer pCVar4;
  pointer pCVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint __val;
  undefined1 auVar7 [16];
  uint uVar8;
  SrcEvaluatorType srcEvaluator;
  ChTriangleMeshShape *pCVar9;
  long *plVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  EigenvectorsType *pEVar12;
  uint uVar13;
  undefined7 in_register_00000009;
  double *pdVar14;
  ulong uVar15;
  uint __len;
  uint uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ChConvexHullLibraryWrapper lh;
  shared_ptr<chrono::ChTriangleMeshShape> vshape;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> points_reduced;
  double mass;
  ChMatrix33<double> principal_inertia_csys;
  ChVector<double> baricenter;
  ChMatrix33<double> inertia;
  ChVector<double> v;
  ChConvexHullLibraryWrapper local_201;
  ChTriangleMeshShape *local_200;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f8;
  shared_ptr<chrono::ChMaterialSurface> *local_1f0;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_1e8;
  double local_1d0;
  element_type *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  shared_ptr<chrono::ChVisualModel> local_1b8;
  shared_ptr<chrono::ChVisualShape> local_1a8;
  undefined4 local_198;
  undefined4 uStack_194;
  double dStack_190;
  double local_188;
  ChMatrix33<double> local_180;
  ChVector<double> local_138;
  ChMatrix33<double> local_120;
  SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_d8;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_1d0 = density;
  pCVar9 = (ChTriangleMeshShape *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)points);
  ChTriangleMeshShape::ChTriangleMeshShape(pCVar9);
  local_200 = pCVar9;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
            (&local_1f8,pCVar9);
  collision::bt_utils::ChConvexHullLibraryWrapper::ChConvexHullLibraryWrapper(&local_201);
  pCVar2 = (local_200->trimesh).
           super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var11 = (local_200->trimesh).
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
    }
  }
  collision::bt_utils::ChConvexHullLibraryWrapper::ComputeHull(&local_201,points,pCVar2);
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
  }
  pCVar9 = local_200;
  if (visualize) {
    local_198 = (undefined4)CONCAT71(in_register_00000009,collide);
    uVar16 = (this->super_ChBodyAuxRef).super_ChBody.super_ChPhysicsItem.super_ChObj.m_identifier;
    __val = -uVar16;
    if (0 < (int)uVar16) {
      __val = uVar16;
    }
    __len = 1;
    if (9 < __val) {
      uVar15 = (ulong)__val;
      uVar8 = 4;
      do {
        __len = uVar8;
        uVar13 = (uint)uVar15;
        if (uVar13 < 100) {
          __len = __len - 2;
          goto LAB_0051b831;
        }
        if (uVar13 < 1000) {
          __len = __len - 1;
          goto LAB_0051b831;
        }
        if (uVar13 < 10000) goto LAB_0051b831;
        uVar15 = uVar15 / 10000;
        uVar8 = __len + 4;
      } while (99999 < uVar13);
      __len = __len + 1;
    }
LAB_0051b831:
    local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)(local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array + 2);
    local_1f0 = material;
    std::__cxx11::string::_M_construct((ulong)&local_120,(char)__len - (char)((int)uVar16 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[0] + (ulong)(uVar16 >> 0x1f)),__len,__val);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,0x983bb1);
    material = local_1f0;
    pdVar1 = local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array + 2;
    pdVar14 = (double *)(plVar10 + 2);
    collide = SUB41(local_198,0);
    if ((double *)*plVar10 == pdVar14) {
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[2] = *pdVar14;
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[3] = (double)plVar10[3];
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[0] = (double)pdVar1;
    }
    else {
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[2] = *pdVar14;
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[0] = (double)*plVar10;
    }
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = (double)plVar10[1];
    *plVar10 = (long)pdVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::_M_assign((string *)&pCVar9->name);
    if ((double *)
        local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
        m_data.array[0] != pdVar1) {
      operator_delete((void *)local_d8.m_eivec.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[0],
                      (long)local_d8.m_eivec.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array[2] + 1);
    }
    if ((double *)
        local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] !=
        local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 2) {
      operator_delete((void *)local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[0],
                      (long)local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                            m_data.array[2] + 1);
    }
    p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
    p_Var11->_M_use_count = 1;
    p_Var11->_M_weak_count = 1;
    p_Var11->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b33b18;
    p_Var11[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var11[1]._M_use_count = 0;
    p_Var11[1]._M_weak_count = 0;
    p_Var11[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var11[2]._M_use_count = 0;
    p_Var11[2]._M_weak_count = 0;
    p_Var11[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var11[2]._M_use_count = 0;
    p_Var11[2]._M_weak_count = 0;
    p_Var11[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var11[3]._M_use_count = 0;
    p_Var11[3]._M_weak_count = 0;
    local_1a8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_200->super_ChVisualShape;
    local_1a8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_1f8._M_pi;
    if (local_1f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1f8._M_pi)->_M_use_count = (local_1f8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1f8._M_pi)->_M_use_count = (local_1f8._M_pi)->_M_use_count + 1;
      }
    }
    local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    local_120.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = (double)&PTR__ChFrame_00b2b308;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = 0.0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[2] = 0.0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[3] = 0.0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[4] = 1.0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[5] = 0.0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[6] = 0.0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[7] = 0.0;
    ChMatrix33<double>::ChMatrix33
              ((ChMatrix33<double> *)
               (local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                m_storage.m_data.array + 8),(ChQuaternion<double> *)&local_120);
    ChVisualModel::AddShape((ChVisualModel *)(p_Var11 + 1),&local_1a8,(ChFrame<double> *)&local_d8);
    if (local_1a8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a8.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
    }
    local_1b8.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ChVisualModel *)(p_Var11 + 1);
    local_1b8.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var11;
    ChPhysicsItem::AddVisualModel((ChPhysicsItem *)this,&local_1b8);
    if (local_1b8.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.super___shared_ptr<chrono::ChVisualModel,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
  }
  local_138.m_data[0] = 0.0;
  local_138.m_data[1] = 0.0;
  local_138.m_data[2] = 0.0;
  pCVar2 = (local_200->trimesh).
           super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var11 = (local_200->trimesh).
            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
    }
  }
  geometry::ChTriangleMeshConnected::ComputeMassProperties
            (pCVar2,true,&local_188,&local_138,&local_120);
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
  }
  local_d8.m_isInitialized = false;
  local_d8.m_eigenvectorsOk = false;
  Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,3,3,1,3,3>>::
  compute<Eigen::Matrix<double,3,3,1,3,3>>
            ((SelfAdjointEigenSolver<Eigen::Matrix<double,3,3,1,3,3>> *)&local_d8,
             (EigenBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_120,0x80);
  if (local_d8.m_isInitialized != false) {
    local_198 = SUB84(local_d8.m_eivalues.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array[0],0);
    uStack_194 = (undefined4)
                 ((ulong)local_d8.m_eivalues.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[0] >> 0x20);
    dStack_190 = local_d8.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[1];
    local_1f0 = (shared_ptr<chrono::ChMaterialSurface> *)
                local_d8.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[2];
    pEVar12 = Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::eigenvectors
                        (&local_d8);
    local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (pEVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[0];
    local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (pEVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[3];
    local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (pEVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[6];
    local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (pEVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[1];
    auVar21._8_8_ = 0;
    auVar21._0_8_ =
         local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         (pEVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[4];
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         (pEVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[7];
    local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         (pEVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[2];
    local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         (pEVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[5];
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         (pEVar12->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[8];
    auVar26._8_8_ = 0;
    auVar26._0_8_ =
         local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar27._8_8_ = 0;
    auVar27._0_8_ =
         local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] *
         local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar22 = vfmsub231sd_fma(auVar27,auVar22,auVar26);
    auVar24._8_8_ = 0;
    auVar24._0_8_ =
         local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
         local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar24 = vfmsub231sd_fma(auVar24,auVar21,auVar26);
    auVar23._8_8_ = 0;
    auVar23._0_8_ =
         local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
         local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar21 = vfmsub231sd_fma(auVar23,auVar21,auVar25);
    if (local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
        auVar21._0_8_ +
        (auVar22._0_8_ *
         local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] -
        local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] *
        auVar24._0_8_) < 0.0) {
      auVar18._0_8_ =
           -local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar18._8_8_ = 0x8000000000000000;
      local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)vmovlpd_avx(auVar18);
      auVar19._0_8_ =
           -local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar19._8_8_ = 0x8000000000000000;
      local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           (double)vmovlpd_avx(auVar19);
      auVar20._0_8_ =
           -local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar20._8_8_ = 0x8000000000000000;
      local_180.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           (double)vmovlpd_avx(auVar20);
    }
    (this->super_ChBodyAuxRef).super_ChBody.density = (float)local_1d0;
    ChVariablesBodyOwnMass::SetBodyMass
              (&(this->super_ChBodyAuxRef).super_ChBody.variables,local_1d0 * local_188);
    auVar7._8_8_ = dStack_190;
    auVar7._0_8_ = CONCAT44(uStack_194,local_198);
    auVar22 = vshufpd_avx(auVar7,auVar7,1);
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = (double)CONCAT44(uStack_194,local_198) * local_1d0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = auVar22._0_8_ * local_1d0;
    local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[2] = local_1d0 * (double)local_1f0;
    ChBody::SetInertiaXX((ChBody *)this,(ChVector<double> *)&local_d8);
    ChFrame<double>::ChFrame((ChFrame<double> *)&local_d8,&local_138,&local_180);
    ChBodyAuxRef::SetFrame_COG_to_REF(&this->super_ChBodyAuxRef,(ChFrame<double> *)&local_d8);
    if (collide != false) {
      if ((material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == (element_type *)0x0) {
        __assert_fail("material",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChBodyEasy.cpp"
                      ,0x164,
                      "void chrono::ChBodyEasyConvexHullAuxRef::SetupBody(std::vector<ChVector<>> &, double, bool, bool, std::shared_ptr<ChMaterialSurface>)"
                     );
      }
      local_1e8.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1e8.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1e8.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      peVar3 = (local_200->trimesh).
               super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var11 = (local_200->trimesh).
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        }
      }
      std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
                (&local_1e8,
                 ((long)(peVar3->m_vertices).
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(peVar3->m_vertices).
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
      }
      uVar16 = 0;
      while( true ) {
        peVar3 = (local_200->trimesh).
                 super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var11 = (local_200->trimesh).
                  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          }
        }
        pCVar4 = (peVar3->m_vertices).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pCVar5 = (peVar3->m_vertices).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
        }
        uVar17 = (ulong)uVar16;
        uVar15 = ((long)pCVar4 - (long)pCVar5 >> 3) * -0x5555555555555555;
        if (uVar15 < uVar17 || uVar15 - uVar17 == 0) break;
        peVar3 = (local_200->trimesh).
                 super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var11 = (local_200->trimesh).
                  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          }
        }
        pCVar4 = (peVar3->m_vertices).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pCVar4 != local_1e8.
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
          local_1e8.
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar17].m_data[0] = pCVar4[uVar17].m_data[0];
          local_1e8.
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar17].m_data[1] = pCVar4[uVar17].m_data[1];
          local_1e8.
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar17].m_data[2] = pCVar4[uVar17].m_data[2];
        }
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
        }
        uVar16 = uVar16 + 1;
      }
      peVar6 = (this->super_ChBodyAuxRef).super_ChBody.collision_model.
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var11 = (this->super_ChBodyAuxRef).super_ChBody.collision_model.
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        }
      }
      (*peVar6->_vptr_ChCollisionModel[3])();
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
      }
      peVar6 = (this->super_ChBodyAuxRef).super_ChBody.collision_model.
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var11 = (this->super_ChBodyAuxRef).super_ChBody.collision_model.
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        }
      }
      local_1c8 = (material->
                  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_1c0 = (material->
                  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
      if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_1c0->_M_use_count = local_1c0->_M_use_count + 1;
        }
      }
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[1] = 0.0;
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[2] = 0.0;
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[3] = 0.0;
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[5] = 0.0;
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[6] = 0.0;
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[7] = 0.0;
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[0] = 1.0;
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[4] = 1.0;
      local_d8.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[8] = 1.0;
      (*peVar6->_vptr_ChCollisionModel[0xf])(peVar6,&local_1c8,&local_1e8);
      if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0);
      }
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
      }
      peVar6 = (this->super_ChBodyAuxRef).super_ChBody.collision_model.
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var11 = (this->super_ChBodyAuxRef).super_ChBody.collision_model.
                super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        }
      }
      (*peVar6->_vptr_ChCollisionModel[4])();
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
      }
      ChBody::SetCollide((ChBody *)this,true);
      if (local_1e8.
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1e8.
                              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e8.
                              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    peVar3 = (local_200->trimesh).
             super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    p_Var11 = (local_200->trimesh).
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      }
    }
    (this->m_mesh).
    super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = peVar3;
    this_00 = (this->m_mesh).
              super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->m_mesh).
    super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var11;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (local_1f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f8._M_pi);
    }
    return;
  }
  __assert_fail("m_isInitialized && \"SelfAdjointEigenSolver is not initialized.\"",
                "/usr/include/eigen3/Eigen/src/Eigenvalues/SelfAdjointEigenSolver.h",0x12e,
                "const RealVectorType &Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double, 3, 3, 1>>::eigenvalues() const [_MatrixType = Eigen::Matrix<double, 3, 3, 1>]"
               );
}

Assistant:

void ChBodyEasyConvexHullAuxRef::SetupBody(std::vector<ChVector<>>& points,
                                           double density,
                                           bool visualize,
                                           bool collide,
                                           std::shared_ptr<ChMaterialSurface> material) {
    auto vshape = chrono_types::make_shared<ChTriangleMeshShape>();
    collision::bt_utils::ChConvexHullLibraryWrapper lh;
    lh.ComputeHull(points, *vshape->GetMesh());
    if (visualize) {
        vshape->SetName("chull_mesh_" + std::to_string(GetIdentifier()));
        auto vmodel = chrono_types::make_shared<ChVisualModel>();
        vmodel->AddShape(vshape);
        this->AddVisualModel(vmodel);
    }

    double mass;
    ChVector<> baricenter;
    ChMatrix33<> inertia;
    vshape->GetMesh()->ComputeMassProperties(true, mass, baricenter, inertia);

    ChMatrix33<> principal_inertia_csys;
    ChVectorN<double, 3> principal_I;
    inertia.SelfAdjointEigenSolve(principal_inertia_csys, principal_I);
    if (principal_inertia_csys.determinant() < 0)
        principal_inertia_csys.col(0) *= -1;

    SetDensity((float)density);
    SetMass(mass * density);
    // this->SetInertia(inertia * density);
    SetInertiaXX(ChVector<>(principal_I) * density);

    // Set the COG coordinates to barycenter, without displacing the REF reference
    SetFrame_COG_to_REF(ChFrame<>(baricenter, principal_inertia_csys));

    if (collide) {
        assert(material);
        // avoid passing to collision the inner points discarded by convex hull
        // processor, so use mesh vertexes instead of all argument points
        std::vector<ChVector<>> points_reduced;
        points_reduced.resize(vshape->GetMesh()->getCoordsVertices().size());
        for (unsigned int i = 0; i < vshape->GetMesh()->getCoordsVertices().size(); ++i)
            points_reduced[i] = vshape->GetMesh()->getCoordsVertices()[i];

        GetCollisionModel()->ClearModel();
        GetCollisionModel()->AddConvexHull(material, points_reduced);
        GetCollisionModel()->BuildModel();
        SetCollide(true);
    }

    m_mesh = vshape->GetMesh();
}